

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestAds::testAdsNotification(TestAds *this,string *param_1)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  string *this_00;
  string local_1078;
  AdsNotificationAttrib attrib;
  AmsAddr unknown;
  uint32_t notification [1024];
  
  lVar2 = AdsPortOpenEx();
  fructose::test_root::get_test_name_abi_cxx11_((string *)notification,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 != 0,(string *)notification,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x2cf);
  this_00 = (string *)notification;
  std::__cxx11::string::~string(this_00);
  attrib.cbLength = 1;
  attrib.nTransMode = 3;
  attrib.nMaxDelay = 0;
  attrib.field_3 = (anon_union_4_2_382c730b_for_AdsNotificationAttrib_3)0xf4240;
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (0,(AmsAddr *)&server,0x4020,0,&attrib,NotifyCallback,0xdeadbeef,(uint *)this_00
                    );
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x748,&local_1078,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncAddDeviceNotificationReqEx(0, &server, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2da);
  std::__cxx11::string::~string((string *)&local_1078);
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (lVar2,(AmsAddr *)0x0,0x4020,0,&attrib,NotifyCallback,0xdeadbeef,(uint *)this_00
                    );
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x749,&local_1078,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncAddDeviceNotificationReqEx(port, nullptr, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2df);
  std::__cxx11::string::~string((string *)&local_1078);
  AmsNetId::AmsNetId(&unknown.netId,'\x01','\x02','\x03','\x04','\x05','\x06');
  unknown.port = 0x353;
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (lVar2,(AmsAddr *)&unknown,0x4020,0,&attrib,NotifyCallback,0xdeadbeef,
                     (uint *)this_00);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 7,&local_1078,
             "GLOBALERR_MISSING_ROUTE == AdsSyncAddDeviceNotificationReqEx(port, &unknown, 0x4020, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2e5);
  std::__cxx11::string::~string((string *)&local_1078);
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (lVar2,(AmsAddr *)&server,0,0,&attrib,NotifyCallback,0xdeadbeef,(uint *)this_00)
  ;
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x701,&local_1078,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncAddDeviceNotificationReqEx(port, &server, 0, 0, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2ea);
  std::__cxx11::string::~string((string *)&local_1078);
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (lVar2,(AmsAddr *)&server,0x4025,0x10000,&attrib,NotifyCallback,0xdeadbeef,
                     (uint *)this_00);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x701,&local_1078,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4025, 0x10000, &attrib, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f0);
  std::__cxx11::string::~string((string *)&local_1078);
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (lVar2,(AmsAddr *)&server,0x4020,4,(AdsNotificationAttrib *)0x0,NotifyCallback,
                     0xdeadbeef,(uint *)this_00);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x741,&local_1078,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, nullptr, &NotifyCallback, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f5);
  std::__cxx11::string::~string((string *)&local_1078);
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (lVar2,(AmsAddr *)&server,0x4020,4,&attrib,
                     (_func_void_AmsAddr_ptr_AdsNotificationHeader_ptr_uint *)0x0,0xdeadbeef,
                     (uint *)this_00);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x741,&local_1078,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, nullptr, hUser, &notification[0])"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2f8);
  std::__cxx11::string::~string((string *)&local_1078);
  lVar3 = AdsSyncAddDeviceNotificationReqEx
                    (lVar2,(AmsAddr *)&server,0x4020,4,&attrib,NotifyCallback,0xdeadbeef,(uint *)0x0
                    );
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x741,&local_1078,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2fb);
  std::__cxx11::string::~string((string *)&local_1078);
  lVar3 = AdsSyncDelDeviceNotificationReqEx(lVar2,(AmsAddr *)&server,0xdeadbeef);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar3 == 0x752,&local_1078,
             "ADSERR_CLIENT_REMOVEHASH == AdsSyncDelDeviceNotificationReqEx(port, &server, 0xDEADBEEF)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x2fe);
  std::__cxx11::string::~string((string *)&local_1078);
  for (lVar3 = 0; lVar3 != 0x400; lVar3 = lVar3 + 1) {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar4 = AdsSyncAddDeviceNotificationReqEx
                      (lVar2,(AmsAddr *)&server,0x4020,4,&attrib,NotifyCallback,(uint)lVar3,
                       (uint *)this_00);
    if ((lVar4 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      poVar5 = std::operator<<((ostream *)&std::cout,"hUser");
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\n");
      bVar1 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar1,&local_1078,
                 "0 == AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser, &notification[hUser])"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x306);
      std::__cxx11::string::~string((string *)&local_1078);
    }
    this_00 = this_00 + 4;
  }
  local_1078._M_dataplus._M_p = (pointer)0x64;
  std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
            ((duration<long,_std::ratio<1L,_1000L>_> *)&local_1078);
  for (lVar3 = 0; lVar3 != 0x200; lVar3 = lVar3 + 1) {
    (this->super_test_base<TestAds>).super_test_root.m_assertion_tested = true;
    lVar4 = AdsSyncDelDeviceNotificationReqEx(lVar2,(AmsAddr *)&server,notification[lVar3]);
    if ((lVar4 != 0) != (this->super_test_base<TestAds>).super_test_root.m_reverse_mode) {
      poVar5 = std::operator<<((ostream *)&std::cout,"hUser");
      poVar5 = std::operator<<(poVar5,": ");
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
      std::operator<<(poVar5,"\n");
      bVar1 = (this->super_test_base<TestAds>).super_test_root.m_reverse_mode;
      fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
      fructose::test_root::test_assert
                ((test_root *)this,bVar1,&local_1078,
                 "0 == AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser])",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x30a);
      std::__cxx11::string::~string((string *)&local_1078);
    }
  }
  lVar2 = AdsPortCloseEx(lVar2);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1078,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,lVar2 == 0,&local_1078,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x30c);
  std::__cxx11::string::~string((string *)&local_1078);
  return;
}

Assistant:

void testAdsNotification(const std::string&)
    {
        const long port = AdsPortOpenEx();

        fructose_assert(0 != port);

        static const size_t MAX_NOTIFICATIONS_PER_PORT = 1024;
        static const size_t LEAKED_NOTIFICATIONS = MAX_NOTIFICATIONS_PER_PORT / 2;
        uint32_t notification[MAX_NOTIFICATIONS_PER_PORT];
        AdsNotificationAttrib attrib = { 1, ADSTRANS_SERVERCYCLE, 0, {1000000} };
        uint32_t hUser = 0xDEADBEEF;

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncAddDeviceNotificationReqEx(0, &server, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncAddDeviceNotificationReqEx(port, nullptr, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncAddDeviceNotificationReqEx(port, &unknown, 0x4020, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide invalid indexGroup
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0, 0, &attrib, &NotifyCallback, hUser,
                                                          &notification[0]));

        // provide invalid indexOffset
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4025, 0x10000, &attrib, &NotifyCallback,
                                                          hUser,
                                                          &notification[0]));

        // provide nullptr to attrib/callback/hNotification
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, nullptr, &NotifyCallback, hUser,
                                                          &notification[0]));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, nullptr, hUser,
                                                          &notification[0]));
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback, hUser,
                                                          nullptr));

        // delete nonexisting notification
        fructose_assert(ADSERR_CLIENT_REMOVEHASH == AdsSyncDelDeviceNotificationReqEx(port, &server, 0xDEADBEEF));

        // normal test
        for (hUser = 0; hUser < MAX_NOTIFICATIONS_PER_PORT; ++hUser) {
            fructose_loop_assert(hUser,
                                 0 ==
                                 AdsSyncAddDeviceNotificationReqEx(port, &server, 0x4020, 4, &attrib, &NotifyCallback,
                                                                   hUser,
                                                                   &notification[hUser]));
        }
        std::this_thread::sleep_for(std::chrono::milliseconds(100));
        for (hUser = 0; hUser < MAX_NOTIFICATIONS_PER_PORT - LEAKED_NOTIFICATIONS; ++hUser) {
            fructose_loop_assert(hUser, 0 == AdsSyncDelDeviceNotificationReqEx(port, &server, notification[hUser]));
        }
        fructose_assert(0 == AdsPortCloseEx(port));
    }